

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * __thiscall
pfederc::Lexer::getLineAt_abi_cxx11_(string *__return_storage_ptr__,Lexer *this,size_t lineIndex)

{
  ulong uVar1;
  size_t sVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_type sVar3;
  const_reference pvVar4;
  value_type vVar5;
  char *pcVar6;
  ulong local_c0;
  size_t lineEndIndex;
  size_t lineStartIndex;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t lineIndex_local;
  Lexer *this_local;
  string *result;
  
  local_20 = lineIndex;
  lineIndex_local = (size_t)this;
  this_local = (Lexer *)__return_storage_ptr__;
  this_00 = getLineIndices(this);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
  if (lineIndex < sVar3) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->lineIndices,local_20);
    sVar2 = local_20;
    uVar1 = *pvVar4;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->lineIndices);
    if (sVar2 == sVar3 - 1) {
      getFileContent_abi_cxx11_(this);
      vVar5 = std::__cxx11::string::length();
    }
    else {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->lineIndices,local_20 + 1);
      vVar5 = *pvVar4;
    }
    local_c0 = vVar5 - 1;
    if ((uVar1 < local_c0) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->fileContent),
       *pcVar6 != '\r')) {
      std::__cxx11::string::operator[]((ulong)&this->fileContent);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->fileContent);
  }
  else {
    std::__cxx11::to_string(&local_60,local_20);
    std::operator+(&local_40,"Out of bounds: ",&local_60);
    fatal("lexer.cpp",0x32,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&lineStartIndex + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&lineStartIndex + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getLineAt(size_t lineIndex) const noexcept {
  if (lineIndex >= getLineIndices().size()) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(lineIndex));
    return "";
  }

  size_t lineStartIndex = lineIndices[lineIndex];
  size_t lineEndIndex = lineIndex == lineIndices.size() - 1
    ? getFileContent().length() - 1 : lineIndices[lineIndex + 1] - 1;
  if (lineEndIndex > lineStartIndex
        && (fileContent[lineEndIndex] == '\r'
          || fileContent[lineEndIndex] == '\n')) {
    --lineEndIndex;
  }

  std::string result(fileContent.substr(lineStartIndex,
    lineEndIndex - lineStartIndex + 1));
  return result;
}